

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O2

int write_header(archive_write *a,archive_entry *entry)

{
  long lVar1;
  long *plVar2;
  la_int64_t *plVar3;
  ulong uVar4;
  wchar_t wVar5;
  uint uVar6;
  mode_t mVar7;
  int iVar8;
  int iVar9;
  archive_string_conv *sc;
  int *piVar10;
  char *pcVar11;
  dev_t dVar12;
  la_int64_t lVar13;
  void *__ptr;
  time_t v;
  size_t sVar14;
  ulong uVar15;
  char *pcVar16;
  int iVar17;
  long lVar18;
  size_t length;
  ulong uVar19;
  size_t len;
  int local_a4;
  char *p;
  size_t local_98;
  char *path;
  char h [76];
  
  plVar3 = (la_int64_t *)a->format_data;
  sc = get_sconv(a);
  wVar5 = _archive_entry_pathname_l(entry,&path,&len,sc);
  uVar19 = 0;
  iVar17 = 0;
  if (wVar5 == L'\0') {
LAB_0014dc6b:
    local_98 = len;
    h[0] = '\0';
    h[1] = '\0';
    h[2] = '\0';
    h[3] = '\0';
    h[4] = '\0';
    h[5] = '\0';
    h[6] = '\0';
    h[7] = '\0';
    h[8] = '\0';
    h[9] = '\0';
    h[10] = '\0';
    h[0xb] = '\0';
    h[0xc] = '\0';
    h[0xd] = '\0';
    h[0xe] = '\0';
    h[0xf] = '\0';
    h[0x10] = '\0';
    h[0x11] = '\0';
    h[0x12] = '\0';
    h[0x13] = '\0';
    h[0x14] = '\0';
    h[0x15] = '\0';
    h[0x16] = '\0';
    h[0x17] = '\0';
    h[0x18] = '\0';
    h[0x19] = '\0';
    h[0x1a] = '\0';
    h[0x1b] = '\0';
    h[0x1c] = '\0';
    h[0x1d] = '\0';
    h[0x1e] = '\0';
    h[0x1f] = '\0';
    h[0x20] = '\0';
    h[0x21] = '\0';
    h[0x22] = '\0';
    h[0x23] = '\0';
    h[0x24] = '\0';
    h[0x25] = '\0';
    h[0x26] = '\0';
    h[0x27] = '\0';
    h[0x28] = '\0';
    h[0x29] = '\0';
    h[0x2a] = '\0';
    h[0x2b] = '\0';
    h[0x2c] = '\0';
    h[0x2d] = '\0';
    h[0x2e] = '\0';
    h[0x2f] = '\0';
    h[0x30] = '\0';
    h[0x31] = '\0';
    h[0x32] = '\0';
    h[0x33] = '\0';
    h[0x34] = '\0';
    h[0x35] = '\0';
    h[0x36] = '\0';
    h[0x37] = '\0';
    h[0x38] = '\0';
    h[0x39] = '\0';
    h[0x3a] = '\0';
    h[0x3b] = '\0';
    h[0x3c] = '\0';
    h[0x3d] = '\0';
    h[0x3e] = '\0';
    h[0x3f] = '\0';
    h[0x40] = '\0';
    h[0x41] = '\0';
    h[0x42] = '\0';
    h[0x43] = '\0';
    h[0x44] = '\0';
    h[0x45] = '\0';
    h[0x46] = '\0';
    h[0x47] = '\0';
    h[0x48] = '\0';
    h[0x49] = '\0';
    h[0x4a] = '\0';
    h[0x4b] = '\0';
    local_a4 = iVar17;
    format_octal(0x71c7,h,6);
    dVar12 = archive_entry_dev(entry);
    format_octal(dVar12,h + 6,6);
    lVar13 = archive_entry_ino64(entry);
    if (lVar13 == 0) {
LAB_0014dd97:
      format_octal(uVar19 & 0xffffffff,h + 0xc,6);
      mVar7 = archive_entry_mode(entry);
      format_octal((ulong)mVar7,h + 0x12,6);
      lVar13 = archive_entry_uid(entry);
      format_octal(lVar13,h + 0x18,6);
      lVar13 = archive_entry_gid(entry);
      format_octal(lVar13,h + 0x1e,6);
      uVar6 = archive_entry_nlink(entry);
      format_octal((ulong)uVar6,h + 0x24,6);
      mVar7 = archive_entry_filetype(entry);
      if ((mVar7 == 0x6000) || (mVar7 = archive_entry_filetype(entry), mVar7 == 0x2000)) {
        dVar12 = archive_entry_rdev(entry);
      }
      else {
        dVar12 = 0;
      }
      format_octal(dVar12,h + 0x2a,6);
      v = archive_entry_mtime(entry);
      format_octal(v,h + 0x30,0xb);
      length = (size_t)((int)local_98 + 1);
      format_octal(length,h + 0x3b,6);
      mVar7 = archive_entry_filetype(entry);
      if (mVar7 != 0x8000) {
        archive_entry_set_size(entry,0);
      }
      wVar5 = _archive_entry_symlink_l(entry,&p,&len,sc);
      iVar17 = local_a4;
      if (wVar5 != L'\0') {
        piVar10 = __errno_location();
        if (*piVar10 == 0xc) {
          pcVar16 = "Can\'t allocate memory for Linkname";
          goto LAB_0014dec5;
        }
        pcVar16 = archive_entry_symlink(entry);
        pcVar11 = archive_string_conversion_charset_name(sc);
        archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar16,pcVar11)
        ;
        iVar17 = -0x14;
      }
      if ((p == (char *)0x0 || len == 0) || (*p == '\0')) {
        sVar14 = archive_entry_size(entry);
      }
      else {
        sVar14 = strlen(p);
      }
      iVar8 = format_octal(sVar14,h + 0x41,0xb);
      if (iVar8 == 0) {
        iVar9 = __archive_write_output(a,h,0x4c);
        iVar8 = -0x1e;
        if ((iVar9 == 0) && (iVar9 = __archive_write_output(a,path,length), iVar9 == 0)) {
          lVar13 = archive_entry_size(entry);
          *plVar3 = lVar13;
          iVar8 = iVar17;
          if ((p != (char *)0x0) && (*p != '\0')) {
            sVar14 = strlen(p);
            iVar9 = __archive_write_output(a,p,sVar14);
            iVar8 = -0x1e;
            if (iVar9 == 0) {
              iVar8 = iVar17;
            }
          }
        }
      }
      else {
        archive_set_error(&a->archive,0x22,"File is too large for cpio format.");
        iVar8 = -0x19;
      }
      goto LAB_0014ded5;
    }
    uVar6 = archive_entry_nlink(entry);
    if (uVar6 < 2) {
      uVar19 = plVar3[1] + 1;
      plVar3[1] = uVar19;
    }
    else {
      uVar15 = plVar3[4];
      uVar19 = 0xffffffffffffffff;
      lVar18 = 0;
      do {
        uVar19 = uVar19 + 1;
        if (uVar15 == uVar19) {
          __ptr = (void *)plVar3[2];
          uVar19 = plVar3[1] + 1;
          plVar3[1] = uVar19;
          uVar4 = plVar3[3];
          if (uVar4 <= uVar15) {
            lVar18 = uVar4 * 2;
            if (uVar4 < 0x200) {
              lVar18 = 0x200;
            }
            __ptr = realloc(__ptr,lVar18 << 4);
            if (__ptr == (void *)0x0) goto LAB_0014de2e;
            plVar3[3] = lVar18;
            plVar3[2] = (la_int64_t)__ptr;
            uVar15 = plVar3[4];
          }
          *(la_int64_t *)((long)__ptr + uVar15 * 0x10) = lVar13;
          *(int *)((long)__ptr + uVar15 * 0x10 + 8) = (int)uVar19;
          plVar3[4] = uVar15 + 1;
          goto LAB_0014dd77;
        }
        lVar1 = lVar18 + 0x10;
        plVar2 = (long *)(plVar3[2] + lVar18);
        lVar18 = lVar1;
      } while (*plVar2 != lVar13);
      uVar19 = (ulong)*(uint *)(plVar3[2] + -8 + lVar1);
    }
LAB_0014dd77:
    if ((int)(uint)uVar19 < 0) {
LAB_0014de2e:
      pcVar16 = "No memory for ino translation table";
      goto LAB_0014dec5;
    }
    if ((uint)uVar19 < 0x40000) goto LAB_0014dd97;
    pcVar16 = "Too many files for this cpio format";
    iVar17 = 0x22;
  }
  else {
    piVar10 = __errno_location();
    if (*piVar10 != 0xc) {
      iVar17 = -0x14;
      pcVar16 = archive_entry_pathname(entry);
      pcVar11 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar16,pcVar11);
      goto LAB_0014dc6b;
    }
    pcVar16 = "Can\'t allocate memory for Pathname";
LAB_0014dec5:
    iVar17 = 0xc;
  }
  archive_set_error(&a->archive,iVar17,pcVar16);
  iVar8 = -0x1e;
LAB_0014ded5:
  archive_entry_free((archive_entry *)0x0);
  return iVar8;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	int64_t ino;
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	char h[c_header_size];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;
	int pad;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	pathlength = (int)len + 1; /* Include trailing null. */

	memset(h, 0, c_header_size);
	format_hex(0x070701, h + c_magic_offset, c_magic_size);
	format_hex(archive_entry_devmajor(entry), h + c_devmajor_offset,
	    c_devmajor_size);
	format_hex(archive_entry_devminor(entry), h + c_devminor_offset,
	    c_devminor_size);

	ino = archive_entry_ino64(entry);
	if (ino > 0xffffffff) {
		archive_set_error(&a->archive, ERANGE,
		    "large inode number truncated");
		ret_final = ARCHIVE_WARN;
	}

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_hex(ino & 0xffffffff, h + c_ino_offset, c_ino_size);
	format_hex(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_hex(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_hex(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_hex(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
	    format_hex(archive_entry_rdevmajor(entry), h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(archive_entry_rdevminor(entry), h + c_rdevminor_offset, c_rdevminor_size);
	} else {
	    format_hex(0, h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(0, h + c_rdevminor_offset, c_rdevminor_size);
	}
	format_hex(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_hex(pathlength, h + c_namesize_offset, c_namesize_size);
	format_hex(0, h + c_checksum_offset, c_checksum_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Likname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_hex(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_hex(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for this format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, c_header_size);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	/* Pad pathname to even length. */
	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	pad = PAD4(pathlength + c_header_size);
	if (pad) {
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);
	cpio->padding = (int)PAD4(cpio->entry_bytes_remaining);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		pad = PAD4(strlen(p));
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	archive_entry_free(entry_main);
	return (ret_final);
}